

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *y;
  undefined8 uVar3;
  Real RVar4;
  SPxStatus stat;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar5;
  type_conflict5 tVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  pointer rhs_00;
  double *pdVar11;
  SPxOut *pSVar12;
  _func_int **pp_Var13;
  undefined7 in_register_00000011;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  cpp_dec_float<50U,_int,_void> *t;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar14;
  uint uVar15;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  DataKey DVar16;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar17;
  char cVar18;
  ulong uVar19;
  bool bVar20;
  Status enterStat;
  uint local_84c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  cpp_dec_float<50U,_int,_void> local_6a8;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  objChange;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  multiprecision local_3e8 [8];
  uint auStack_3e0 [2];
  uint local_3d8 [2];
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  int local_3c0;
  undefined1 local_3bc;
  fpclass_type local_3b8;
  int32_t iStack_3b4;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  undefined8 local_388;
  int local_380;
  undefined1 local_37c;
  fpclass_type local_378;
  int32_t iStack_374;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308 [2];
  int local_300;
  undefined1 local_2fc;
  fpclass_type local_2f8;
  int32_t iStack_2f4;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268 [2];
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t iStack_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  multiprecision local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [2];
  int local_100;
  undefined1 local_fc;
  fpclass_type local_f8;
  int32_t iStack_f4;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t iStack_74;
  multiprecision local_68 [56];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  local_84c = (uint)CONCAT71(in_register_00000011,polish);
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 10;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems._32_5_ = 0;
  enterTest.m_backend.data._M_elems[9]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 10;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems._24_5_ = 0;
  enterUB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterUB.m_backend.data._M_elems._32_5_ = 0;
  enterUB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 10;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems._24_5_ = 0;
  enterLB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterLB.m_backend.data._M_elems._32_5_ = 0;
  enterLB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 10;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems._24_5_ = 0;
  enterVal.m_backend.data._M_elems[7]._1_3_ = 0;
  enterVal.m_backend.data._M_elems._32_5_ = 0;
  enterVal.m_backend._37_8_ = 0;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 10;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems._32_5_ = 0;
  enterMax.m_backend.data._M_elems[9]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_6a8.fpclass = cpp_dec_float_finite;
  local_6a8.prec_elem = 10;
  local_6a8.data._M_elems[0] = 0;
  local_6a8.data._M_elems[1] = 0;
  local_6a8.data._M_elems[2] = 0;
  local_6a8.data._M_elems[3] = 0;
  local_6a8.data._M_elems[4] = 0;
  local_6a8.data._M_elems[5] = 0;
  local_6a8.data._M_elems._24_5_ = 0;
  local_6a8.data._M_elems[7]._1_3_ = 0;
  local_6a8.data._M_elems._32_5_ = 0;
  local_6a8.data._M_elems[9]._1_3_ = 0;
  local_6a8.exp = 0;
  local_6a8.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 10;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems._24_5_ = 0;
  enterRO.m_backend.data._M_elems[7]._1_3_ = 0;
  enterRO.m_backend.data._M_elems._32_5_ = 0;
  enterRO.m_backend.data._M_elems[9]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&objChange);
  iVar9 = (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x7e])(this,enterId);
  uVar10 = local_84c;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar9);
  bVar7 = this->instableEnter;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_6a8
             ,&enterStat,&enterRO,&objChange);
  if (uVar10 == 0) {
    epsilon(&leavebound,this);
    result.m_backend.data._M_elems[7]._1_3_ = leavebound.m_backend.data._M_elems[7]._1_3_;
    result.m_backend.data._M_elems._24_5_ = leavebound.m_backend.data._M_elems._24_5_;
    result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
    uVar3 = result.m_backend.data._M_elems._0_8_;
    result.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[9]._1_3_ = leavebound.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.data._M_elems._32_5_ = leavebound.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
    result.m_backend.exp = leavebound.m_backend.exp;
    result.m_backend.neg = leavebound.m_backend.neg;
    result.m_backend.fpclass = leavebound.m_backend.fpclass;
    result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result.m_backend.data._M_elems[0] != 0) {
      result.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_8_ = uVar3;
    tVar6 = boost::multiprecision::operator>(&enterTest,&result);
    if (!tVar6) goto LAB_00206438;
    local_88 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                        enterTest.m_backend.data._M_elems._32_5_);
    local_98 = enterTest.m_backend.data._M_elems[4];
    uStack_94 = enterTest.m_backend.data._M_elems[5];
    uStack_90 = enterTest.m_backend.data._M_elems[6];
    uStack_8c = enterTest.m_backend.data._M_elems[7];
    local_a8 = enterTest.m_backend.data._M_elems[0];
    uStack_a4 = enterTest.m_backend.data._M_elems[1];
    uStack_a0 = enterTest.m_backend.data._M_elems[2];
    uStack_9c = enterTest.m_backend.data._M_elems[3];
    local_80 = enterTest.m_backend.exp;
    local_7c = enterTest.m_backend.neg;
    local_78 = enterTest.m_backend.fpclass;
    iStack_74 = enterTest.m_backend.prec_elem;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x84])(this,enterId->super_DataKey,&local_a8,(ulong)(uint)enterStat);
    pp_Var13 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
    bVar20 = false;
  }
  else {
LAB_00206438:
    pUVar14 = this->theFvec;
    if (((pUVar14->thedelta).setupStatus == true) && ((pUVar14->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(&this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,&pUVar14->thedelta,rhs);
    }
    cVar18 = (char)uVar10;
    if ((cVar18 == '\0') && (this->m_maxCycle < this->m_numCycle)) {
      result.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
      result.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
      uVar3 = result.m_backend.data._M_elems._0_8_;
      result.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
      result.m_backend.exp = enterMax.m_backend.exp;
      result.m_backend.neg = enterMax.m_backend.neg;
      result.m_backend.fpclass = enterMax.m_backend.fpclass;
      result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
      result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
          result.m_backend.data._M_elems[0] != 0) {
        result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
      }
      leavebound.m_backend.data._M_elems._0_8_ =
           leavebound.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      result.m_backend.data._M_elems._0_8_ = uVar3;
      tVar6 = boost::multiprecision::operator>(&result,(int *)&leavebound);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[(ulong)tVar6 + 0x89])(this);
    }
    result.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar3 = result.m_backend.data._M_elems._0_8_;
    result.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result.m_backend.exp = enterMax.m_backend.exp;
    result.m_backend.neg = enterMax.m_backend.neg;
    result.m_backend.fpclass = enterMax.m_backend.fpclass;
    result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
       ) {
      result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    this->boundflips = 0;
    local_c8 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                        enterTest.m_backend.data._M_elems._32_5_);
    local_d8 = enterTest.m_backend.data._M_elems[4];
    uStack_d4 = enterTest.m_backend.data._M_elems[5];
    uStack_d0 = enterTest.m_backend.data._M_elems[6];
    uStack_cc = enterTest.m_backend.data._M_elems[7];
    local_e8 = enterTest.m_backend.data._M_elems[0];
    uStack_e4 = enterTest.m_backend.data._M_elems[1];
    uStack_e0 = enterTest.m_backend.data._M_elems[2];
    uStack_dc = enterTest.m_backend.data._M_elems[3];
    local_c0 = enterTest.m_backend.exp;
    local_bc = enterTest.m_backend.neg;
    local_b8 = enterTest.m_backend.fpclass;
    iStack_b4 = enterTest.m_backend.prec_elem;
    result.m_backend.data._M_elems._0_8_ = uVar3;
    uVar10 = (*this->theratiotester->_vptr_SPxRatioTester[7])();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->instableEnterVal).m_backend,0);
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    bVar20 = -1 < (int)uVar10;
    if (bVar20) {
      local_128 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
      auStack_120[0] = result.m_backend.data._M_elems[2];
      auStack_120[1] = result.m_backend.data._M_elems[3];
      local_118[0] = result.m_backend.data._M_elems[4];
      local_118[1] = result.m_backend.data._M_elems[5];
      auStack_110[0] = result.m_backend.data._M_elems[6];
      auStack_110[1] = result.m_backend.data._M_elems[7];
      local_108[0] = result.m_backend.data._M_elems[8];
      local_108[1] = result.m_backend.data._M_elems[9];
      local_100 = result.m_backend.exp;
      local_fc = result.m_backend.neg;
      local_f8 = result.m_backend.fpclass;
      iStack_f4 = result.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&leavebound,local_128,arg);
      entertol(&result_4,this);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_4);
      if (tVar6) {
        pnVar2 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 8);
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar10].m_backend.data;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
        local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_168.m_backend.exp = pnVar2[uVar10].m_backend.exp;
        local_168.m_backend.neg = pnVar2[uVar10].m_backend.neg;
        local_168.m_backend.fpclass = pnVar2[uVar10].m_backend.fpclass;
        local_168.m_backend.prec_elem = pnVar2[uVar10].m_backend.prec_elem;
        pnVar2 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 8);
        local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar10].m_backend.data;
        local_1a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
        local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_1a8.m_backend.exp = pnVar2[uVar10].m_backend.exp;
        local_1a8.m_backend.neg = pnVar2[uVar10].m_backend.neg;
        local_1a8.m_backend.fpclass = pnVar2[uVar10].m_backend.fpclass;
        local_1a8.m_backend.prec_elem = pnVar2[uVar10].m_backend.prec_elem;
        RVar4 = Tolerances::epsilon((this->
                                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    )._tolerances.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        bVar7 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_168,&local_1a8,RVar4);
        if (((bVar7) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this->m_numCycle = this->m_numCycle + 1;
          this->enterCycles = this->enterCycles + 1;
        }
      }
      else {
        this->m_numCycle = this->m_numCycle / 2;
      }
      pSVar17 = this->coSolveVector2;
      y = this->coSolveVector3;
      this_00 = &this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      x = &this->theCoPvec->thedelta;
      rhs_00 = (this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10;
      if (y == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0) {
        if (pSVar17 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar17,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector2rhs);
        }
      }
      else {
        if (pSVar17 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector3rhs);
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar17,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector2rhs,this->coSolveVector3rhs);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this->theCoPvec,this->coSolveVector3);
      }
      local_84c = uVar10;
      if (0 < this->boundflips) {
        uVar19 = ((long)(this->coSolveVector3->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->coSolveVector3->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff;
        while (0 < (int)uVar19) {
          uVar19 = uVar19 - 1;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_68,this->coSolveVector3,(int)uVar19);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&leavebound,local_68,arg_01);
          epsilon(&result_4,this);
          tVar6 = boost::multiprecision::operator>(&leavebound,&result_4);
          if (tVar6) {
            pUVar14 = this->thePvec;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&result_4,this->coSolveVector3,(int)uVar19);
            leavebound.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            leavebound.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
            uVar3 = leavebound.m_backend.data._M_elems._0_8_;
            leavebound.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
            leavebound.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
            leavebound.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
            leavebound.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
            leavebound.m_backend.exp = result_4.m_backend.exp;
            leavebound.m_backend.neg = result_4.m_backend.neg;
            leavebound.m_backend.fpclass = result_4.m_backend.fpclass;
            leavebound.m_backend.prec_elem = result_4.m_backend.prec_elem;
            leavebound.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            if (result_4.m_backend.fpclass != cpp_dec_float_finite ||
                leavebound.m_backend.data._M_elems[0] != 0) {
              leavebound.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
            }
            leavebound.m_backend.data._M_elems._0_8_ = uVar3;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar14,&leavebound,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)((this->thecovectors->set).theitem +
                          (this->thecovectors->set).thekey[uVar19 & 0xffffffff].idx));
          }
        }
        if ((enterId->super_DataKey).info < 1) {
          pUVar14 = this->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&leavebound,enterId);
          pLVar5 = &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        else {
          pUVar14 = this->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&leavebound,enterId);
          pLVar5 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number(&(pLVar5->
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).set,(DataKey *)&leavebound);
        pnVar2 = (pUVar14->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_6a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar9].m_backend;
        local_6a8.data._M_elems._8_8_ = *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
        local_6a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_6a8.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_6a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        uVar3 = *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 8);
        local_6a8.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_6a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_6a8.exp = pnVar2[iVar9].m_backend.exp;
        local_6a8.neg = pnVar2[iVar9].m_backend.neg;
        local_6a8.fpclass = pnVar2[iVar9].m_backend.fpclass;
        local_6a8.prec_elem = pnVar2[iVar9].m_backend.prec_elem;
        this->totalboundflips = this->totalboundflips + this->boundflips;
      }
      pnVar2 = (this->theCoPrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar2[uVar10].m_backend.data._M_elems + 8) =
           CONCAT35(enterRO.m_backend.data._M_elems[9]._1_3_,enterRO.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterRO.m_backend.data._M_elems[7]._1_3_,enterRO.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterRO.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterRO.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterRO.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterRO.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterRO.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterRO.m_backend.prec_elem;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_4.m_backend,&enterRO.m_backend,&local_6a8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_7.m_backend,&this->theFvec->thedelta,local_84c);
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 10;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems._24_5_ = 0;
      leavebound.m_backend.data._M_elems[7]._1_3_ = 0;
      leavebound.m_backend.data._M_elems._32_5_ = 0;
      leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&leavebound.m_backend,&result_4.m_backend,&result_7.m_backend);
      pUVar14 = this->theCoPvec;
      *(ulong *)((pUVar14->theval).m_backend.data._M_elems + 8) =
           CONCAT35(leavebound.m_backend.data._M_elems[9]._1_3_,
                    leavebound.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 4) =
           leavebound.m_backend.data._M_elems._16_8_;
      *(ulong *)((pUVar14->theval).m_backend.data._M_elems + 6) =
           CONCAT35(leavebound.m_backend.data._M_elems[7]._1_3_,
                    leavebound.m_backend.data._M_elems._24_5_);
      *(undefined8 *)(pUVar14->theval).m_backend.data._M_elems =
           leavebound.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 2) =
           leavebound.m_backend.data._M_elems._8_8_;
      (pUVar14->theval).m_backend.exp = leavebound.m_backend.exp;
      (pUVar14->theval).m_backend.neg = leavebound.m_backend.neg;
      (pUVar14->theval).m_backend.fpclass = leavebound.m_backend.fpclass;
      (pUVar14->theval).m_backend.prec_elem = leavebound.m_backend.prec_elem;
      pUVar14 = this->theCoPvec;
      epsilon(&leavebound,this);
      tVar6 = boost::multiprecision::operator>(&pUVar14->theval,&leavebound);
      if (tVar6) {
LAB_00206f89:
        uVar15 = local_84c;
        if (this->thePricing == FULL) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&(this->thePvec->theval).m_backend,&(this->theCoPvec->theval).m_backend);
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x86])(this);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x87])(this);
      }
      else {
        pUVar14 = this->theCoPvec;
        epsilon(&result_7,this);
        result_4.m_backend.data._M_elems[0] = result_7.m_backend.data._M_elems[0];
        result_4.m_backend.data._M_elems[1] = result_7.m_backend.data._M_elems[1];
        uVar3 = result_4.m_backend.data._M_elems._0_8_;
        result_4.m_backend.data._M_elems[2] = result_7.m_backend.data._M_elems[2];
        result_4.m_backend.data._M_elems[3] = result_7.m_backend.data._M_elems[3];
        result_4.m_backend.data._M_elems._32_5_ = result_7.m_backend.data._M_elems._32_5_;
        result_4.m_backend.data._M_elems[9]._1_3_ = result_7.m_backend.data._M_elems[9]._1_3_;
        result_4.m_backend.data._M_elems[4] = result_7.m_backend.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = result_7.m_backend.data._M_elems[5];
        result_4.m_backend.data._M_elems._24_5_ = result_7.m_backend.data._M_elems._24_5_;
        result_4.m_backend.data._M_elems[7]._1_3_ = result_7.m_backend.data._M_elems[7]._1_3_;
        result_4.m_backend.exp = result_7.m_backend.exp;
        result_4.m_backend.neg = result_7.m_backend.neg;
        result_4.m_backend.fpclass = result_7.m_backend.fpclass;
        result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
        result_4.m_backend.data._M_elems[0] = result_7.m_backend.data._M_elems[0];
        if (result_7.m_backend.fpclass != cpp_dec_float_finite ||
            result_4.m_backend.data._M_elems[0] != 0) {
          result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
        }
        result_4.m_backend.data._M_elems._0_8_ = uVar3;
        tVar6 = boost::multiprecision::operator<(&pUVar14->theval,&result_4);
        uVar15 = local_84c;
        if (tVar6) goto LAB_00206f89;
      }
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 10;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems._24_5_ = 0;
      leavebound.m_backend.data._M_elems[7]._1_3_ = 0;
      leavebound.m_backend.data._M_elems._32_5_ = 0;
      leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      local_1e8 = enterMax.m_backend.data._M_elems[0];
      uStack_1e4 = enterMax.m_backend.data._M_elems[1];
      uStack_1e0 = enterMax.m_backend.data._M_elems[2];
      uStack_1dc = enterMax.m_backend.data._M_elems[3];
      local_1d8 = enterMax.m_backend.data._M_elems[4];
      uStack_1d4 = enterMax.m_backend.data._M_elems[5];
      uStack_1d0 = enterMax.m_backend.data._M_elems[6];
      uStack_1cc = enterMax.m_backend.data._M_elems[7];
      local_1c8 = CONCAT35(enterMax.m_backend.data._M_elems[9]._1_3_,
                           enterMax.m_backend.data._M_elems._32_5_);
      local_1c0 = enterMax.m_backend.exp;
      local_1bc = enterMax.m_backend.neg;
      local_1b8 = enterMax.m_backend.fpclass;
      iStack_1b4 = enterMax.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x82])(this,(ulong)uVar15,&local_1e8,&leavebound,&objChange);
      pnVar2 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar2[uVar10].m_backend.data._M_elems + 8) =
           CONCAT35(enterUB.m_backend.data._M_elems[9]._1_3_,enterUB.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterUB.m_backend.data._M_elems[7]._1_3_,enterUB.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterUB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterUB.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterUB.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterUB.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterUB.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterUB.m_backend.prec_elem;
      pnVar2 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar2[uVar10].m_backend.data._M_elems + 8) =
           CONCAT35(enterLB.m_backend.data._M_elems[9]._1_3_,enterLB.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterLB.m_backend.data._M_elems[7]._1_3_,enterLB.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterLB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterLB.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterLB.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterLB.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterLB.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterLB.m_backend.prec_elem;
      updateCoTest(this);
      if (this->thePricing == FULL) {
        updateTest(this);
      }
      pUVar14 = this->theFvec;
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 8) =
           result.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 6) =
           result.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(pUVar14->theval).m_backend.data._M_elems =
           result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (pUVar14->theval).m_backend.exp = result.m_backend.exp;
      (pUVar14->theval).m_backend.neg = result.m_backend.neg;
      (pUVar14->theval).m_backend.fpclass = result.m_backend.fpclass;
      (pUVar14->theval).m_backend.prec_elem = result.m_backend.prec_elem;
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::update(this->theFvec);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_4.m_backend,&enterVal.m_backend,&result.m_backend);
      pnVar2 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar2[uVar10].m_backend.data._M_elems + 8) =
           CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,
                    result_4.m_backend.data._M_elems._32_5_);
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = result_4.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(result_4.m_backend.data._M_elems[7]._1_3_,
                    result_4.m_backend.data._M_elems._24_5_);
      *(undefined8 *)&pnVar2[uVar10].m_backend = result_4.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           result_4.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = result_4.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = result_4.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = result_4.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = result_4.m_backend.prec_elem;
      epsilon(&result_4,this);
      tVar6 = boost::multiprecision::operator>(&leavebound,&result_4);
      if (tVar6) {
LAB_002072a3:
        result_4.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        result_4.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
        uVar3 = result_4.m_backend.data._M_elems._0_8_;
        result_4.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
        result_4.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
        result_4.m_backend.data._M_elems._32_5_ = leavebound.m_backend.data._M_elems._32_5_;
        result_4.m_backend.data._M_elems[9]._1_3_ = leavebound.m_backend.data._M_elems[9]._1_3_;
        result_4.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
        result_4.m_backend.data._M_elems._24_5_ = leavebound.m_backend.data._M_elems._24_5_;
        result_4.m_backend.data._M_elems[7]._1_3_ = leavebound.m_backend.data._M_elems[7]._1_3_;
        result_4.m_backend.exp = leavebound.m_backend.exp;
        result_4.m_backend.neg = leavebound.m_backend.neg;
        result_4.m_backend.fpclass = leavebound.m_backend.fpclass;
        result_4.m_backend.prec_elem = leavebound.m_backend.prec_elem;
        result_4.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
            result_4.m_backend.data._M_elems[0] != 0) {
          result_4.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
        }
        result_4.m_backend.data._M_elems._0_8_ = uVar3;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,&result_4,
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).matrix.data[uVar10]);
      }
      else {
        epsilon(&local_4a0,this);
        result_7.m_backend.data._M_elems[0] = local_4a0.m_backend.data._M_elems[0];
        result_7.m_backend.data._M_elems[1] = local_4a0.m_backend.data._M_elems[1];
        uVar3 = result_7.m_backend.data._M_elems._0_8_;
        result_7.m_backend.data._M_elems[2] = local_4a0.m_backend.data._M_elems[2];
        result_7.m_backend.data._M_elems[3] = local_4a0.m_backend.data._M_elems[3];
        result_7.m_backend.data._M_elems[8] = local_4a0.m_backend.data._M_elems[8];
        result_7.m_backend.data._M_elems[9] = local_4a0.m_backend.data._M_elems[9];
        result_7.m_backend.data._M_elems[4] = local_4a0.m_backend.data._M_elems[4];
        result_7.m_backend.data._M_elems[5] = local_4a0.m_backend.data._M_elems[5];
        result_7.m_backend.data._M_elems[6] = local_4a0.m_backend.data._M_elems[6];
        result_7.m_backend.data._M_elems[7] = local_4a0.m_backend.data._M_elems[7];
        result_7.m_backend.exp = local_4a0.m_backend.exp;
        result_7.m_backend.neg = local_4a0.m_backend.neg;
        result_7.m_backend.fpclass = local_4a0.m_backend.fpclass;
        result_7.m_backend.prec_elem = local_4a0.m_backend.prec_elem;
        result_7.m_backend.data._M_elems[0] = local_4a0.m_backend.data._M_elems[0];
        if (local_4a0.m_backend.fpclass != cpp_dec_float_finite ||
            result_7.m_backend.data._M_elems[0] != 0) {
          result_7.m_backend.neg = (bool)(local_4a0.m_backend.neg ^ 1);
        }
        result_7.m_backend.data._M_elems._0_8_ = uVar3;
        tVar6 = boost::multiprecision::operator<(&leavebound,&result_7);
        if (tVar6) goto LAB_002072a3;
      }
      epsilon(&result_4,this);
      tVar6 = boost::multiprecision::operator>(&enterVal,&result_4);
      if (tVar6) {
LAB_002073e5:
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,&enterVal,rhs);
      }
      else {
        epsilon(&local_4a0,this);
        result_7.m_backend.data._M_elems[0] = local_4a0.m_backend.data._M_elems[0];
        result_7.m_backend.data._M_elems[1] = local_4a0.m_backend.data._M_elems[1];
        uVar3 = result_7.m_backend.data._M_elems._0_8_;
        result_7.m_backend.data._M_elems[2] = local_4a0.m_backend.data._M_elems[2];
        result_7.m_backend.data._M_elems[3] = local_4a0.m_backend.data._M_elems[3];
        result_7.m_backend.data._M_elems[8] = local_4a0.m_backend.data._M_elems[8];
        result_7.m_backend.data._M_elems[9] = local_4a0.m_backend.data._M_elems[9];
        result_7.m_backend.data._M_elems[4] = local_4a0.m_backend.data._M_elems[4];
        result_7.m_backend.data._M_elems[5] = local_4a0.m_backend.data._M_elems[5];
        result_7.m_backend.data._M_elems[6] = local_4a0.m_backend.data._M_elems[6];
        result_7.m_backend.data._M_elems[7] = local_4a0.m_backend.data._M_elems[7];
        result_7.m_backend.exp = local_4a0.m_backend.exp;
        result_7.m_backend.neg = local_4a0.m_backend.neg;
        result_7.m_backend.fpclass = local_4a0.m_backend.fpclass;
        result_7.m_backend.prec_elem = local_4a0.m_backend.prec_elem;
        result_7.m_backend.data._M_elems[0] = local_4a0.m_backend.data._M_elems[0];
        if (local_4a0.m_backend.fpclass != cpp_dec_float_finite ||
            result_7.m_backend.data._M_elems[0] != 0) {
          result_7.m_backend.neg = (bool)(local_4a0.m_backend.neg ^ 1);
        }
        result_7.m_backend.data._M_elems._0_8_ = uVar3;
        tVar6 = boost::multiprecision::operator<(&enterVal,&result_7);
        if (tVar6) goto LAB_002073e5;
      }
      local_268[0].m_backend.data._M_elems[8] = objChange.sum.m_backend.data._M_elems[8];
      local_268[0].m_backend.data._M_elems[9] = objChange.sum.m_backend.data._M_elems[9];
      local_268[0].m_backend.data._M_elems[4] = objChange.sum.m_backend.data._M_elems[4];
      local_268[0].m_backend.data._M_elems[5] = objChange.sum.m_backend.data._M_elems[5];
      local_268[0].m_backend.data._M_elems[6] = objChange.sum.m_backend.data._M_elems[6];
      local_268[0].m_backend.data._M_elems[7] = objChange.sum.m_backend.data._M_elems[7];
      local_268[0].m_backend.data._M_elems[0] = objChange.sum.m_backend.data._M_elems[0];
      local_268[0].m_backend.data._M_elems[1] = objChange.sum.m_backend.data._M_elems[1];
      local_268[0].m_backend.data._M_elems[2] = objChange.sum.m_backend.data._M_elems[2];
      local_268[0].m_backend.data._M_elems[3] = objChange.sum.m_backend.data._M_elems[3];
      local_268[0].m_backend.exp = objChange.sum.m_backend.exp;
      local_268[0].m_backend.neg = objChange.sum.m_backend.neg;
      local_268[0].m_backend.fpclass = objChange.sum.m_backend.fpclass;
      local_268[0].m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
      updateNonbasicValue(this,local_268);
      pSVar17 = &this->theFvec->thedelta;
      pp_Var13 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      uVar19 = (ulong)uVar15;
      goto LAB_00207532;
    }
    local_5b8.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
    local_5b8.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
    local_5b8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_5b8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_5b8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_5b8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_5b8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_5b8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_5b8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_5b8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_5b8.m_backend.exp = result.m_backend.exp;
    local_5b8.m_backend.neg = result.m_backend.neg;
    local_5b8.m_backend.fpclass = result.m_backend.fpclass;
    local_5b8.m_backend.prec_elem = result.m_backend.prec_elem;
    result_10.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_10.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_10.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_10.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar3 = result_10.m_backend.data._M_elems._0_8_;
    result_10.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_10.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_10.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_10.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_10.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result_10.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result_10.m_backend.exp = enterMax.m_backend.exp;
    result_10.m_backend.neg = enterMax.m_backend.neg;
    result_10.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_10.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_10.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_10.m_backend.data._M_elems[0] != 0) {
      result_10.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    result_10.m_backend.data._M_elems._0_8_ = uVar3;
    RVar4 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_5b8,&result_10,RVar4);
    if (!bVar8) {
      if (cVar18 == '\0') {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&leavebound.m_backend,*pdVar11,(type *)0x0);
        tVar6 = boost::multiprecision::operator<
                          (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&leavebound.m_backend);
        if (tVar6) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar11,(type *)0x0);
          tVar6 = boost::multiprecision::operator>
                            (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_4.m_backend);
          if (tVar6) {
            (**(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffffffffffff,enterId,rhs,0);
            pUVar14 = this->theFvec;
            *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 8) =
                 result.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 4) =
                 result.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 6) =
                 result.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(pUVar14->theval).m_backend.data._M_elems =
                 result.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pUVar14->theval).m_backend.data._M_elems + 2) =
                 result.m_backend.data._M_elems._8_8_;
            (pUVar14->theval).m_backend.exp = result.m_backend.exp;
            (pUVar14->theval).m_backend.neg = result.m_backend.neg;
            (pUVar14->theval).m_backend.fpclass = result.m_backend.fpclass;
            (pUVar14->theval).m_backend.prec_elem = result.m_backend.prec_elem;
            UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::update(this->theFvec);
            local_328 = result.m_backend.data._M_elems[0];
            uStack_324 = result.m_backend.data._M_elems[1];
            uStack_320 = result.m_backend.data._M_elems[2];
            uStack_31c = result.m_backend.data._M_elems[3];
            local_318 = result.m_backend.data._M_elems[4];
            uStack_314 = result.m_backend.data._M_elems[5];
            uStack_310 = result.m_backend.data._M_elems[6];
            uStack_30c = result.m_backend.data._M_elems[7];
            local_308[0] = result.m_backend.data._M_elems[8];
            local_308[1] = result.m_backend.data._M_elems[9];
            local_300 = result.m_backend.exp;
            local_2fc = result.m_backend.neg;
            local_2f8 = result.m_backend.fpclass;
            iStack_2f4 = result.m_backend.prec_elem;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])
                      (this,enterId->super_DataKey,(ulong)(uint)enterStat,&local_328,rhs,&objChange)
            ;
            local_368.m_backend.data._M_elems[8] = objChange.sum.m_backend.data._M_elems[8];
            local_368.m_backend.data._M_elems[9] = objChange.sum.m_backend.data._M_elems[9];
            local_368.m_backend.data._M_elems[4] = objChange.sum.m_backend.data._M_elems[4];
            local_368.m_backend.data._M_elems[5] = objChange.sum.m_backend.data._M_elems[5];
            local_368.m_backend.data._M_elems[6] = objChange.sum.m_backend.data._M_elems[6];
            local_368.m_backend.data._M_elems[7] = objChange.sum.m_backend.data._M_elems[7];
            local_368.m_backend.data._M_elems[0] = objChange.sum.m_backend.data._M_elems[0];
            local_368.m_backend.data._M_elems[1] = objChange.sum.m_backend.data._M_elems[1];
            local_368.m_backend.data._M_elems[2] = objChange.sum.m_backend.data._M_elems[2];
            local_368.m_backend.data._M_elems[3] = objChange.sum.m_backend.data._M_elems[3];
            local_368.m_backend.exp = objChange.sum.m_backend.exp;
            local_368.m_backend.neg = objChange.sum.m_backend.neg;
            local_368.m_backend.fpclass = objChange.sum.m_backend.fpclass;
            local_368.m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
            updateNonbasicValue(this,&local_368);
            return bVar20;
          }
        }
      }
      local_388 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                           enterTest.m_backend.data._M_elems._32_5_);
      local_398 = enterTest.m_backend.data._M_elems[4];
      uStack_394 = enterTest.m_backend.data._M_elems[5];
      uStack_390 = enterTest.m_backend.data._M_elems[6];
      uStack_38c = enterTest.m_backend.data._M_elems[7];
      local_3a8 = enterTest.m_backend.data._M_elems[0];
      uStack_3a4 = enterTest.m_backend.data._M_elems[1];
      uStack_3a0 = enterTest.m_backend.data._M_elems[2];
      uStack_39c = enterTest.m_backend.data._M_elems[3];
      local_380 = enterTest.m_backend.exp;
      local_37c = enterTest.m_backend.neg;
      local_378 = enterTest.m_backend.fpclass;
      iStack_374 = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,enterId->super_DataKey,&local_3a8,(ulong)(uint)enterStat);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffffffffffff,&none,0,0);
      if (cVar18 != '\0') {
        return bVar20;
      }
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar12 = this->spxout;
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_4.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar12 = soplex::operator<<(pSVar12,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
        return bVar20;
      }
      uStack_3d0 = CONCAT44(enterTest.m_backend.data._M_elems[7],
                            enterTest.m_backend.data._M_elems[6]);
      local_3e8 = (multiprecision  [8])enterTest.m_backend.data._M_elems._0_8_;
      auStack_3e0[0] = enterTest.m_backend.data._M_elems[2];
      auStack_3e0[1] = enterTest.m_backend.data._M_elems[3];
      local_3d8[0] = enterTest.m_backend.data._M_elems[4];
      local_3d8[1] = enterTest.m_backend.data._M_elems[5];
      local_3c8 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                           enterTest.m_backend.data._M_elems._32_5_);
      local_3c0 = enterTest.m_backend.exp;
      local_3bc = enterTest.m_backend.neg;
      local_3b8 = enterTest.m_backend.fpclass;
      iStack_3b4 = enterTest.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&leavebound,local_3e8,arg_00);
      entertol(&result_4,this);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_4);
      pSVar12 = this->spxout;
      if (tVar6) {
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_4.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar20;
      }
      if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
        leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
        result_4.m_backend.data._M_elems[0] = 5;
        (*pSVar12->_vptr_SPxOut[2])();
        pSVar12 = soplex::operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar12 = soplex::operator<<(pSVar12,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
      }
      if (this->theRep == ROW) {
        local_428.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
        local_428.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
        local_428.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_428.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_428.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        local_428.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
        local_428.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_428.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_428.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_428.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_428.m_backend.exp = result.m_backend.exp;
        local_428.m_backend.neg = result.m_backend.neg;
        local_428.m_backend.fpclass = result.m_backend.fpclass;
        local_428.m_backend.prec_elem = result.m_backend.prec_elem;
        computeDualfarkas4Row(this,&local_428,(SPxId)enterId->super_DataKey);
        stat = INFEASIBLE;
      }
      else {
        local_468.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
        local_468.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
        local_468.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_468.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_468.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        local_468.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
        local_468.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_468.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_468.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_468.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_468.m_backend.exp = result.m_backend.exp;
        local_468.m_backend.neg = result.m_backend.neg;
        local_468.m_backend.fpclass = result.m_backend.fpclass;
        local_468.m_backend.prec_elem = result.m_backend.prec_elem;
        computePrimalray4Col(this,&local_468,(SPxId)enterId->super_DataKey);
        stat = UNBOUNDED;
      }
      setBasisStatus(this,stat);
      return bVar20;
    }
    DVar16 = enterId->super_DataKey;
    if (bVar7 == false) {
      (this->instableEnterId).super_DataKey = DVar16;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 8) =
           CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                    enterTest.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 4) =
           enterTest.m_backend.data._M_elems._16_8_;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 6) =
           CONCAT44(enterTest.m_backend.data._M_elems[7],enterTest.m_backend.data._M_elems[6]);
      *(undefined8 *)(this->instableEnterVal).m_backend.data._M_elems =
           enterTest.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 2) =
           enterTest.m_backend.data._M_elems._8_8_;
      (this->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar16 = enterId->super_DataKey;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0x40240000;
      t = &local_2a8;
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (t,&enterTest.m_backend,(double *)&leavebound);
      pp_Var13 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    else {
      local_2e8.data._M_elems[9]._1_3_ = enterTest.m_backend.data._M_elems[9]._1_3_;
      local_2e8.data._M_elems._32_5_ = enterTest.m_backend.data._M_elems._32_5_;
      t = &local_2e8;
      local_2e8.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      local_2e8.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      local_2e8.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      local_2e8.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      local_2e8.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      local_2e8.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      local_2e8.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      local_2e8.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      local_2e8.exp = enterTest.m_backend.exp;
      local_2e8.neg = enterTest.m_backend.neg;
      local_2e8.fpclass = enterTest.m_backend.fpclass;
      local_2e8.prec_elem = enterTest.m_backend.prec_elem;
      pp_Var13 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    (*pp_Var13[0x84])(this,DVar16,t,(ulong)(uint)enterStat);
    pp_Var13 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
  }
  uVar19 = 0xffffffffffffffff;
  enterId = &none;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0;
  pSVar17 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
LAB_00207532:
  (**pp_Var13)(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,uVar19,enterId,rhs,pSVar17);
  return bVar20;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}